

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# b-plus-tree.cpp
# Opt level: O3

int __thiscall BPTree::display(BPTree *this,Node *cursor,int nodecount,bool first)

{
  bool bVar1;
  int iVar2;
  ostream *poVar3;
  Node *pNVar4;
  ulong uVar5;
  undefined7 in_register_00000009;
  ulong uVar6;
  long lVar7;
  long lVar8;
  
  if ((int)CONCAT71(in_register_00000009,first) == 0) {
    if (cursor->IS_LEAF == false) {
      if (-1 < cursor->size) {
        lVar7 = -1;
        do {
          iVar2 = display(this,cursor->ptr[lVar7 + 1],0,false);
          nodecount = nodecount + iVar2;
          lVar7 = lVar7 + 1;
        } while (lVar7 < cursor->size);
      }
      iVar2 = nodecount + 1;
    }
    else {
      iVar2 = 1;
      if (0 < cursor->size) {
        lVar7 = 0;
        lVar8 = 0;
        do {
          poVar3 = std::ostream::_M_insert<double>
                             ((ostream *)&std::cout,
                              (double)*(float *)((long)&cursor->key->key_value + lVar7));
          std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
          lVar8 = lVar8 + 1;
          lVar7 = lVar7 + 0x20;
        } while (lVar8 < cursor->size);
      }
    }
  }
  else {
    uVar5 = (ulong)(uint)cursor->size;
    if (-1 < cursor->size) {
      uVar6 = 0;
      do {
        if (uVar6 != (uVar5 & 0xffffffff)) {
          poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0);
          std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
          poVar3 = std::ostream::_M_insert<double>(poVar3,(double)cursor->key[uVar6].key_value);
          std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
        }
        poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,1);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
        pNVar4 = cursor->ptr[uVar6];
        if (0 < pNVar4->size) {
          lVar7 = 0;
          lVar8 = 0;
          do {
            poVar3 = std::ostream::_M_insert<double>
                               ((ostream *)&std::cout,
                                (double)*(float *)((long)&pNVar4->key->key_value + lVar7));
            std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
            lVar8 = lVar8 + 1;
            pNVar4 = cursor->ptr[uVar6];
            lVar7 = lVar7 + 0x20;
          } while (lVar8 < pNVar4->size);
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n",1);
        uVar5 = (ulong)cursor->size;
        bVar1 = (long)uVar6 < (long)uVar5;
        uVar6 = uVar6 + 1;
      } while (bVar1);
    }
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

int display(Node* cursor, int nodecount, bool first) {
        if (first == true) {
            for (int i = 0;i<cursor->size+1 ; i++){
                if (i!=cursor->size) {
                    cout << 0 << " " << cursor->key[i].key_value << "\n";
                }
                cout << 1 << "\n";
                //cout << cursor->ptr[i]->size << " Size \n";
                for (int j = 0; j<cursor->ptr[i]->size; j++){
                    cout << cursor->ptr[i]->key[j].key_value << " ";
                }
                cout << "\n";
            }
            return 0;
        }
        else {
        int thisnode;
        if (cursor->IS_LEAF == false) {
            for (int i = 0; i < cursor->size + 1; i++) {
                thisnode = display(cursor->ptr[i], 0, false);
                nodecount = nodecount + thisnode;
                //cout<<"\n"<<nodecount<<"\n";

                //read(curr->child_ptr[i]);

            }
            nodecount++;
            return nodecount;
        }
        if (cursor->IS_LEAF == true) {

            for (int i = 0; i < cursor->size; i++) {
                cout << cursor->key[i].key_value << " ";
            }
            return 1;
        }
        return 0;
    }
    }